

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::DumpByteCode
          (JsBuiltInEngineInterfaceExtensionObject *this,JsBuiltInFile_conflict file)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  FunctionBody *dumpFunction;
  
  Output::Print(L"Dumping JS Built Ins Byte Code:\n");
  if (file == Object_constructor) {
    dumpFunction = (this->jsBuiltInObject_constructorBytecode).ptr;
    if (dumpFunction != (FunctionBody *)0x0) goto LAB_00bd2111;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0xdb,"(this->jsBuiltInObject_constructorBytecode != nullptr)",
                                "this->jsBuiltInObject_constructorBytecode != nullptr");
    if (!bVar2) goto LAB_00bd211f;
    pTVar4 = &this->jsBuiltInObject_constructorBytecode;
  }
  else if (file == Math_object) {
    dumpFunction = (this->jsBuiltInMath_objectBytecode).ptr;
    if (dumpFunction != (FunctionBody *)0x0) goto LAB_00bd2111;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0xdb,"(this->jsBuiltInMath_objectBytecode != nullptr)",
                                "this->jsBuiltInMath_objectBytecode != nullptr");
    if (!bVar2) goto LAB_00bd211f;
    pTVar4 = &this->jsBuiltInMath_objectBytecode;
  }
  else {
    if (file != Array_prototype) {
      return;
    }
    dumpFunction = (this->jsBuiltInArray_prototypeBytecode).ptr;
    if (dumpFunction != (FunctionBody *)0x0) goto LAB_00bd2111;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0xdb,"(this->jsBuiltInArray_prototypeBytecode != nullptr)",
                                "this->jsBuiltInArray_prototypeBytecode != nullptr");
    if (!bVar2) {
LAB_00bd211f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pTVar4 = &this->jsBuiltInArray_prototypeBytecode;
  }
  *puVar3 = 0;
  dumpFunction = pTVar4->ptr;
LAB_00bd2111:
  ByteCodeDumper::DumpRecursively(dumpFunction);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::DumpByteCode(JsBuiltInFile file)
    {
        Output::Print(_u("Dumping JS Built Ins Byte Code:\n"));
        switch (file)
        {
            #define fileCase(class, type, obj) \
            case class##_##type: \
                Assert(this->jsBuiltIn##class##_##type##Bytecode != nullptr); \
                Js::ByteCodeDumper::DumpRecursively(this->jsBuiltIn##class##_##type##Bytecode); \
                break;
            JsBuiltIns(fileCase)
            #undef fileCase
        }
    }